

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O1

void decodeQuantum(uchar *dest,char *src)

{
  uchar uVar1;
  long lVar2;
  long lVar3;
  char cVar4;
  ulong uVar5;
  
  uVar5 = 0;
  lVar2 = 0;
  do {
    cVar4 = 'A';
    lVar3 = 0;
    do {
      if (cVar4 == *src) goto LAB_00104693;
      cVar4 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[lVar3 + 1];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x40);
    lVar3 = 0x40;
LAB_00104693:
    if (cVar4 == *src) {
      uVar5 = uVar5 * 0x40 + lVar3;
    }
    else if (*src == '=') {
      uVar5 = uVar5 << 6;
    }
    lVar2 = lVar2 + 1;
    src = src + 1;
    if (lVar2 == 4) {
      uVar1 = curlx_ultouc(uVar5 & 0xff);
      dest[2] = uVar1;
      uVar1 = curlx_ultouc((ulong)((uint)(uVar5 >> 8) & 0xff));
      dest[1] = uVar1;
      uVar1 = curlx_ultouc((ulong)((uint)uVar5 >> 0x10 & 0xff));
      *dest = uVar1;
      return;
    }
  } while( true );
}

Assistant:

static void decodeQuantum(unsigned char *dest, const char *src)
{
  const char *s, *p;
  unsigned long i, v, x = 0;

  for(i = 0, s = src; i < 4; i++, s++) {
    v = 0;
    p = table64;
    while(*p && (*p != *s)) {
      v++;
      p++;
    }
    if(*p == *s)
      x = (x << 6) + v;
    else if(*s == '=')
      x = (x << 6);
  }

  dest[2] = curlx_ultouc(x & 0xFFUL);
  x >>= 8;
  dest[1] = curlx_ultouc(x & 0xFFUL);
  x >>= 8;
  dest[0] = curlx_ultouc(x & 0xFFUL);
}